

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.cpp
# Opt level: O2

void coda_url_preunescape(char *s,char *dest,size_t sz)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lStack_50;
  char xnum_1 [3];
  char xnum [3];
  
  uVar6 = 0;
LAB_00104fa1:
  do {
    while( true ) {
      cVar1 = *s;
      if ((cVar1 == '\0') || (sz + 5 <= uVar6)) {
        dest[uVar6] = '\0';
        return;
      }
      if (cVar1 == '\\') break;
      if (cVar1 != '%') goto LAB_001050aa;
      cVar2 = s[1];
      iVar4 = isxdigit((int)cVar2);
      if (iVar4 == 0) goto LAB_001050aa;
      cVar3 = s[2];
      iVar4 = isxdigit((int)cVar3);
      if (iVar4 == 0) goto LAB_001050aa;
      xnum[2] = '\0';
      xnum[0] = cVar2;
      xnum[1] = cVar3;
      lVar5 = strtol(xnum,(char **)0x0,0x10);
      if ((char)lVar5 < '\0') {
        dest[uVar6] = (char)lVar5;
        lStack_50 = 1;
      }
      else {
        lStack_50 = 3;
        if (uVar6 + 4 < sz) {
          dest[uVar6 + 2] = s[2];
          *(undefined2 *)(dest + uVar6) = *(undefined2 *)s;
          lStack_50 = 3;
        }
      }
      uVar6 = uVar6 + lStack_50;
      s = s + 3;
    }
    if (s[1] == 'x') {
      cVar2 = s[2];
      iVar4 = isxdigit((int)cVar2);
      if (iVar4 != 0) {
        cVar3 = s[3];
        iVar4 = isxdigit((int)cVar3);
        if (iVar4 != 0) {
          xnum_1[2] = '\0';
          xnum_1[0] = cVar2;
          xnum_1[1] = cVar3;
          lVar5 = strtol(xnum_1,(char **)0x0,0x10);
          if ((char)lVar5 < '\0') {
            dest[uVar6] = (char)lVar5;
            uVar6 = uVar6 + 1;
          }
          else if (uVar6 + 3 < sz) {
            *(undefined4 *)(dest + uVar6) = *(undefined4 *)s;
          }
          s = s + 4;
          goto LAB_00104fa1;
        }
      }
    }
LAB_001050aa:
    dest[uVar6] = cVar1;
    uVar6 = uVar6 + 1;
    s = s + 1;
  } while( true );
}

Assistant:

void coda_url_preunescape(const char* s, char* dest, size_t sz)
{
	size_t ptr = 0;
	while (*s && (ptr < sz + 5))
	{
		if ((*s == '%') && isxdigit(s[1]) && isxdigit(s[2]))
		{
			char xnum[3];
			xnum[0] = s[1];
			xnum[1] = s[2];
			xnum[2] = 0;
			uint8_t c = strtol(xnum, 0, 16);
			if (c & 0x80)
			{
				dest[ptr] = (char)c;
				ptr++;
			}
			else
			{
				if (ptr + 4 < sz) memcpy(dest + ptr, s, 3);
				ptr += 3;
			}
			s += 3;
		}
		else if ((*s == '\\') && (s[1] == 'x') && isxdigit(s[2]) && isxdigit(s[3]))
		{
			char xnum[3];
			xnum[0] = s[2];
			xnum[1] = s[3];
			xnum[2] = 0;
			uint8_t c = strtol(xnum, 0, 16);
			if (c & 0x80)
			{
				dest[ptr] = (char)c;
				ptr++;
			}
			else
			{
				if (ptr + 3 < sz) memcpy(dest + ptr, s, 4);
			}
			s += 4;
		}
		else
		{
			dest[ptr] = *s;
			ptr++;
			s++;
		}
	}
	dest[ptr] = 0;
}